

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

Vec3 __thiscall
deqp::gles2::Functional::MatrixCaseUtils::reduceToVec3(MatrixCaseUtils *this,Mat4 *value)

{
  Vector<float,_3> VVar1;
  Vec3 VVar2;
  Vector<float,_3> local_70;
  Vector<float,_3> local_60;
  Vector<float,_3> local_50;
  Vector<float,_3> local_44;
  tcu local_38 [12];
  tcu local_2c [12];
  float fVar3;
  
  local_50.m_data[2] = (value->m_data).m_data[0].m_data[2];
  local_50.m_data._0_8_ = *(undefined8 *)(value->m_data).m_data[0].m_data;
  local_60.m_data[2] = (value->m_data).m_data[1].m_data[3];
  local_60.m_data._0_8_ = *(undefined8 *)((value->m_data).m_data[1].m_data + 1);
  tcu::operator+(local_38,&local_50,&local_60);
  local_70.m_data[2] = (value->m_data).m_data[2].m_data[0];
  local_70.m_data._0_8_ = *(undefined8 *)((value->m_data).m_data[2].m_data + 2);
  tcu::operator+(local_2c,(Vector<float,_3> *)local_38,&local_70);
  local_44.m_data[0] = (value->m_data).m_data[3].m_data[3];
  local_44.m_data._4_8_ = *(undefined8 *)(value->m_data).m_data[3].m_data;
  VVar1 = tcu::operator+((tcu *)this,(Vector<float,_3> *)local_2c,&local_44);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  return (Vec3)VVar2.m_data;
}

Assistant:

inline tcu::Vec3 reduceToVec3 (const tcu::Mat4& value) { return value.getColumn(0).swizzle(0,1,2) + value.getColumn(1).swizzle(1,2,3) + value.getColumn(2).swizzle(2,3,0) + value.getColumn(3).swizzle(3,0,1); }